

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::ServiceGenerator::GenerateStubMethods
          (ServiceGenerator *this,Printer *printer)

{
  long lVar1;
  mapped_type *pmVar2;
  undefined1 qualified;
  _Rb_tree_header *p_Var3;
  int i;
  ulong uVar4;
  allocator<char> local_b9;
  long local_b8;
  Printer *local_b0;
  ServiceGenerator *local_a8;
  string local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sub_vars;
  key_type local_50;
  
  local_b8 = 0x20;
  local_b0 = printer;
  local_a8 = this;
  for (uVar4 = 0; (long)uVar4 < (long)*(int *)(local_a8->descriptor_ + 0x20); uVar4 = uVar4 + 1) {
    lVar1 = *(long *)(local_a8->descriptor_ + 0x28);
    sub_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    sub_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var3 = &sub_vars._M_t._M_impl.super__Rb_tree_header;
    sub_vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sub_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    sub_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"classname",(allocator<char> *)&local_50);
    qualified = SUB81(p_Var3,0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&sub_vars._M_t,&local_a0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"name",(allocator<char> *)&local_50);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&sub_vars._M_t,&local_a0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_a0);
    SimpleItoa_abi_cxx11_(&local_a0,(protobuf *)(uVar4 & 0xffffffff),i);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"index",&local_b9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&sub_vars._M_t,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    ClassName_abi_cxx11_
              (&local_a0,*(cxx **)(lVar1 + -8 + local_b8),(Descriptor *)0x1,(bool)qualified);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"input_type",&local_b9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&sub_vars._M_t,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    ClassName_abi_cxx11_(&local_a0,*(cxx **)(lVar1 + local_b8),(Descriptor *)0x1,(bool)qualified);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"output_type",&local_b9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&sub_vars._M_t,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    io::Printer::Print(local_b0,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&sub_vars._M_t,
                       "const ::google::protobuf::rpc::Error $classname$_Stub::$name$(\n  const $input_type$* request,\n  $output_type$* response) {\n  return client_->CallMethod(descriptor()->method($index$), request, response);\n}\n"
                      );
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&sub_vars._M_t);
    local_b8 = local_b8 + 0x30;
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateStubMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    map<string, string> sub_vars;
    sub_vars["classname"] = descriptor_->name();
    sub_vars["name"] = method->name();
    sub_vars["index"] = SimpleItoa(i);
    sub_vars["input_type"] = ClassName(method->input_type(), true);
    sub_vars["output_type"] = ClassName(method->output_type(), true);

    printer->Print(sub_vars,
      "const ::google::protobuf::rpc::Error $classname$_Stub::$name$(\n"
      "  const $input_type$* request,\n"
      "  $output_type$* response) {\n"
      "  return client_->CallMethod(descriptor()->method($index$), request, response);\n"
      "}\n");
  }
}